

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>,_char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                  *this,char *begin,char *end)

{
  type tVar1;
  char *in_RDX;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_RDI;
  type tVar2;
  iterator it;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_00000058;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_00000060;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  f;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  basic_format_context<fmt::v5::internal::counting_iterator<char>,_char> *in_stack_ffffffffffffff30;
  type arg_type;
  basic_format_specs<char> *in_stack_ffffffffffffff38;
  context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
  *this_00;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
  *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  format_specs *in_stack_ffffffffffffff70;
  context_type *in_stack_ffffffffffffff78;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  local_30;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_28;
  char *local_20;
  iterator local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  local_28 = internal::
             context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
             ::parse_context((context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
                              *)&(in_RDI->format_str_).size_);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_RDI,(iterator)in_stack_ffffffffffffff38);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_context<fmt::v5::internal::counting_iterator<char>,_char> *)
                     &(in_RDI->format_str_).size_);
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>&,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                    ((custom_formatter<char,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
                     (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                      *)in_stack_ffffffffffffff80);
  if (tVar1) {
    local_8 = basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
                        ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x288421);
  }
  else {
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)in_stack_ffffffffffffff30);
    internal::
    specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
    ::specs_handler((specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     *)in_RDI,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    arg_type = (type)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
    ::type((basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
            *)(in_RDI + 4));
    internal::
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
                     *)in_RDI,
                    (specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     *)in_stack_ffffffffffffff38,arg_type);
    local_18 = internal::
               parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&>
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      internal::error_handler::on_error((error_handler *)in_RDI,(char *)in_stack_ffffffffffffff38);
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
              (in_RDI,(iterator)in_stack_ffffffffffffff38);
    this_00 = (context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
               *)&(in_RDI->format_str_).size_;
    arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
    arg_formatter(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    tVar2 = visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
                      (in_stack_00000060,in_stack_00000058);
    it._9_7_ = 0;
    it.count_ = (long)tVar2._0_9_;
    it.blackhole_ = (char)(tVar2._0_9_ >> 0x40);
    internal::
    context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
    ::advance_to(this_00,it);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }